

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

bool google::protobuf::io::Tokenizer::IsIdentifier(string *text)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  long local_40;
  ulong local_38;
  
  if (text->_M_string_length == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = false;
    pbVar2 = (byte *)std::__cxx11::string::at((ulong)text);
    if ((*pbVar2 == 0x5f) || ((byte)((*pbVar2 & 0xdf) + 0xbf) < 0x1a)) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)text);
      uVar3 = 0xffffffffffffffff;
      do {
        uVar4 = local_38;
        if (uVar3 - local_38 == -1) break;
        bVar1 = anon_unknown_4::Alphanumeric::InClass(*(char *)(local_40 + 1 + uVar3));
        uVar4 = uVar3 + 1;
        uVar3 = uVar4;
      } while (bVar1);
      bVar1 = local_38 <= uVar4;
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return bVar1;
}

Assistant:

bool Tokenizer::IsIdentifier(const string& text) {
  // Mirrors IDENTIFIER definition in Tokenizer::Next() above.
  if (text.size() == 0)
    return false;
  if (!Letter::InClass(text.at(0)))
    return false;
  if (!AllInClass<Alphanumeric>(text.substr(1)))
    return false;
  return true;
}